

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

int CVmObjBigNum::precision_from_string(char *str,size_t len,int radix)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  utf8_ptr p;
  size_t rem;
  double local_38;
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar5 = radix == 0x10;
  }
  else {
    bVar5 = false;
  }
  if (radix == 10) {
    iVar1 = precision_from_string(str,len);
    return iVar1;
  }
  p.p_ = str;
  rem = len;
  while( true ) {
    if (rem == 0) goto LAB_00230c60;
    wVar2 = utf8_ptr::s_getch(p.p_);
    iVar1 = is_space(wVar2);
    if (iVar1 == 0) break;
    utf8_ptr::inc(&p,&rem);
  }
  if (rem == 0) goto LAB_00230c60;
  wVar2 = utf8_ptr::s_getch(p.p_);
  if (wVar2 != L'-') {
    wVar2 = utf8_ptr::s_getch(p.p_);
    if (wVar2 != L'+') goto LAB_00230c60;
  }
  do {
    utf8_ptr::inc(&p,&rem);
LAB_00230c60:
    iVar1 = 0;
    if (rem == 0) goto LAB_00230cda;
    wVar2 = utf8_ptr::s_getch(p.p_);
    iVar3 = is_space(wVar2);
  } while (iVar3 != 0);
  if ((bool)(bVar5 & rem != 0)) {
    wVar2 = utf8_ptr::s_getch(p.p_);
    if (wVar2 == L'0') {
      wVar2 = utf8_ptr::s_getch_at(p.p_,1);
      if (wVar2 != L'x') {
        wVar2 = utf8_ptr::s_getch_at(p.p_,1);
        bVar5 = false;
        if (wVar2 != L'X') goto LAB_00230cec;
      }
      utf8_ptr::inc(&p,&rem);
      iVar1 = 0;
      bVar5 = false;
      do {
        utf8_ptr::inc(&p,&rem);
LAB_00230cec:
        if (rem == 0) goto LAB_00230d34;
        wVar2 = utf8_ptr::s_getch(p.p_);
        uVar4 = wVar2 + L'\xffffffd0';
        if (9 < uVar4) {
          if ((uint)(wVar2 + L'\xffffffbf') < 0x1a) {
            uVar4 = wVar2 + L'\xffffffc9';
          }
          else {
            if (0x19 < (uint)(wVar2 + L'\xffffff9f')) {
LAB_00230d34:
              local_38 = (double)iVar1;
              dVar6 = log10((double)radix);
              dVar6 = ceil(dVar6 * local_38);
              return (int)dVar6;
            }
            uVar4 = wVar2 + L'\xffffffa9';
          }
        }
        if (radix <= (int)uVar4) goto LAB_00230d34;
        if (wVar2 != L'0') {
          bVar5 = true;
        }
        iVar1 = (iVar1 + 1) - (uint)!bVar5;
      } while( true );
    }
  }
LAB_00230cda:
  bVar5 = false;
  goto LAB_00230cec;
}

Assistant:

int CVmObjBigNum::precision_from_string(const char *str, size_t len, int radix)
{
    /* if the radix is zero, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);

    /* for decimal values, parse the full floating point format */
    if (radix == 10)
        return precision_from_string(str, len);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* scan digits */
    int prec, significant = FALSE;
    for (prec = 0 ; rem != 0 ; p.inc(&rem))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* it's significant if it's not a leading zero */
        if (ch != '0')
            significant = TRUE;

        /* 
         *   if we have found a significant digit so far, count this one - do
         *   not count leading zeros, whether they occur before or after the
         *   decimal point 
         */
        if (significant)
            ++prec;
    }

    /*
     *   Figure the decimal precision required to hold a number in the given
     *   radix.  This is a simple linear conversion: N base-R digits require
     *   log(R)/log(10) decimal digits.  Using log10 as our canonical log
     *   base means that log(R)/log(10) == log(R)/1 == log(R).  We of course
     *   have to round up for any fractional digits.
     */
    return (int)ceil(prec * log10((double)radix));
}